

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O2

void test_binary(void)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 uStackY_40;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 uVar5;
  uint32_t len;
  bson_subtype_t subtype;
  uint8_t *binary;
  
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  uVar2 = bson_bcon_magic();
  uVar2 = bcon_new(0,"foo",uVar2,4,0,"deadbeef",CONCAT44(uVar5,8),0);
  uVar3 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar2,"foo",uVar3,4,&subtype,&binary,&len,0);
  if (cVar1 == '\0') {
    pcVar4 = "BCON_EXTRACT (bcon, \"foo\", BCONE_BIN (subtype, binary, len))";
    uStackY_40 = 0x3e;
  }
  else if (subtype == BSON_SUBTYPE_BINARY) {
    if (len == 8) {
      if (*(long *)binary == 0x6665656264616564) {
        bson_destroy(uVar2);
        return;
      }
      pcVar4 = "memcmp (binary, \"deadbeef\", 8) == 0";
      uStackY_40 = 0x42;
    }
    else {
      pcVar4 = "len == 8";
      uStackY_40 = 0x41;
    }
  }
  else {
    pcVar4 = "subtype == BSON_SUBTYPE_BINARY";
    uStackY_40 = 0x40;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
          ,uStackY_40,"test_binary",pcVar4);
  abort();
}

Assistant:

static void
test_binary (void)
{
   bson_t bcon, expected;

   bson_init (&bcon);
   bson_init (&expected);

   bson_append_binary (
      &expected, "foo", -1, BSON_SUBTYPE_BINARY, (uint8_t *) "deadbeef", 8);

   BCON_APPEND (&bcon,
                "foo",
                BCON_BIN (BSON_SUBTYPE_BINARY, (const uint8_t *) "deadbeef", 8),
                NULL);

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
}